

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt32 * tt_cmap14_variants(TT_CMap cmap,FT_Memory memory)

{
  FT_Byte *pFVar1;
  FT_Face pFVar2;
  FT_Error FVar3;
  FT_CMap_Class pFVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  
  pFVar1 = cmap->data;
  pFVar2 = cmap[1].cmap.charmap.face;
  FVar3 = tt_cmap14_ensure((TT_CMap14)cmap,(int)pFVar2 + 1,memory);
  if (FVar3 == 0) {
    uVar5 = (ulong)pFVar2 & 0xffffffff;
    pbVar7 = pFVar1 + 10;
    pFVar4 = cmap[1].cmap.clazz;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      *(uint *)((long)&pFVar4->size + uVar6 * 4) =
           (uint)pbVar7[2] | (uint)pbVar7[1] << 8 | (uint)*pbVar7 << 0x10;
      pbVar7 = pbVar7 + 0xb;
    }
    *(FT_UInt32 *)((long)&pFVar4->size + uVar5 * 4) = 0;
  }
  else {
    pFVar4 = (FT_CMap_Class)0x0;
  }
  return (FT_UInt32 *)pFVar4;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32* )
  tt_cmap14_variants( TT_CMap    cmap,
                      FT_Memory  memory )
  {
    TT_CMap14   cmap14 = (TT_CMap14)cmap;
    FT_UInt32   count  = cmap14->num_selectors;
    FT_Byte*    p      = cmap->data + 10;
    FT_UInt32*  result;
    FT_UInt32   i;


    if ( tt_cmap14_ensure( cmap14, ( count + 1 ), memory ) )
      return NULL;

    result = cmap14->results;
    for ( i = 0; i < count; i++ )
    {
      result[i] = (FT_UInt32)TT_NEXT_UINT24( p );
      p        += 8;
    }
    result[i] = 0;

    return result;
  }